

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGuiStb::STB_TEXTEDIT_DELETECHARS(ImGuiTextEditState *obj,int pos,int n)

{
  ImWchar IVar1;
  int iVar2;
  ImWchar *in_text;
  
  in_text = (obj->Text).Data + pos;
  iVar2 = ImTextCountUtf8BytesFromStr(in_text,in_text + n);
  obj->CurLenA = obj->CurLenA - iVar2;
  obj->CurLenW = obj->CurLenW - n;
  IVar1 = in_text[n];
  while (IVar1 != 0) {
    *in_text = IVar1;
    IVar1 = in_text[(long)n + 1];
    in_text = in_text + 1;
  }
  *in_text = 0;
  return;
}

Assistant:

static void STB_TEXTEDIT_DELETECHARS(STB_TEXTEDIT_STRING* obj, int pos, int n)
{
    ImWchar* dst = obj->Text.Data + pos;

    // We maintain our buffer length in both UTF-8 and wchar formats
    obj->CurLenA -= ImTextCountUtf8BytesFromStr(dst, dst + n);
    obj->CurLenW -= n;

    // Offset remaining text
    const ImWchar* src = obj->Text.Data + pos + n;
    while (ImWchar c = *src++)
        *dst++ = c;
    *dst = '\0';
}